

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane::~IfcCurveBoundedPlane
          (IfcCurveBoundedPlane *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_IfcBoundedSurface).super_IfcSurface.
                    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[0xfffffffffffffffd]) = vtt[0x19];
  *(void **)&(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x1a];
  *(void **)&(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x1b];
  *(void **)&(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
             field_0x30 = vtt[0x1c];
  *(void **)&(this->super_IfcBoundedSurface).super_IfcSurface.field_0x40 = vtt[0x1d];
  std::
  _Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  ::~_Vector_base((_Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
                   *)&this->InnerBoundaries);
  return;
}

Assistant:

IfcCurveBoundedPlane() : Object("IfcCurveBoundedPlane") {}